

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool-options.h
# Opt level: O0

void __thiscall
wasm::ToolOptions::ToolOptions(ToolOptions *this,string *command,string *description)

{
  string *psVar1;
  ToolOptions *pTVar2;
  anon_class_8_1_8991fb9c local_f40;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_f38;
  allocator<char> local_f11;
  string local_f10 [39];
  allocator<char> local_ee9;
  string local_ee8 [39];
  allocator<char> local_ec1;
  string local_ec0 [39];
  allocator<char> local_e99;
  string local_e98 [32];
  anon_class_8_1_8991fb9c local_e78;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_e70;
  allocator<char> local_e49;
  string local_e48 [39];
  allocator<char> local_e21;
  string local_e20 [39];
  allocator<char> local_df9;
  string local_df8 [39];
  allocator<char> local_dd1;
  string local_dd0 [32];
  anon_class_8_1_8991fb9c local_db0;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_da8;
  allocator<char> local_d81;
  string local_d80 [39];
  allocator<char> local_d59;
  string local_d58 [39];
  allocator<char> local_d31;
  string local_d30 [39];
  allocator<char> local_d09;
  string local_d08 [32];
  anon_class_8_1_8991fb9c local_ce8;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_ce0;
  allocator<char> local_cb9;
  string local_cb8 [39];
  allocator<char> local_c91;
  string local_c90 [39];
  allocator<char> local_c69;
  string local_c68 [39];
  allocator<char> local_c41;
  string local_c40 [32];
  anon_class_8_1_8991fb9c local_c20;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_c18;
  allocator<char> local_bf1;
  string local_bf0 [39];
  allocator<char> local_bc9;
  string local_bc8 [39];
  allocator<char> local_ba1;
  string local_ba0 [39];
  allocator<char> local_b79;
  string local_b78 [32];
  anon_class_8_1_8991fb9c local_b58;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_b50;
  allocator<char> local_b29;
  string local_b28 [39];
  allocator<char> local_b01;
  string local_b00 [39];
  allocator<char> local_ad9;
  string local_ad8 [39];
  allocator<char> local_ab1;
  string local_ab0 [32];
  anon_class_8_1_8991fb9c local_a90;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_a88;
  allocator<char> local_a61;
  string local_a60 [39];
  allocator<char> local_a39;
  string local_a38 [39];
  allocator<char> local_a11;
  string local_a10 [39];
  allocator<char> local_9e9;
  string local_9e8 [39];
  anon_class_1_0_00000001 local_9c1;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_9c0;
  allocator<char> local_999;
  string local_998 [39];
  allocator<char> local_971;
  string local_970 [39];
  allocator<char> local_949;
  string local_948 [39];
  allocator<char> local_921;
  string local_920 [39];
  anon_class_1_0_00000001 local_8f9;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_8f8;
  allocator<char> local_8d1;
  string local_8d0 [39];
  allocator<char> local_8a9;
  string local_8a8 [39];
  allocator<char> local_881;
  string local_880 [39];
  allocator<char> local_859;
  string local_858 [36];
  FeatureSet local_834;
  FeatureSet local_830;
  allocator<char> local_829;
  string local_828;
  FeatureSet local_804;
  FeatureSet local_800;
  allocator<char> local_7f9;
  string local_7f8;
  FeatureSet local_7d4;
  FeatureSet local_7d0;
  allocator<char> local_7c9;
  string local_7c8;
  FeatureSet local_7a4;
  FeatureSet local_7a0;
  allocator<char> local_799;
  string local_798;
  FeatureSet local_774;
  FeatureSet local_770;
  allocator<char> local_769;
  string local_768;
  FeatureSet local_744;
  FeatureSet local_740;
  allocator<char> local_739;
  string local_738;
  FeatureSet local_714;
  FeatureSet local_710;
  allocator<char> local_709;
  string local_708;
  FeatureSet local_6e4;
  FeatureSet local_6e0;
  allocator<char> local_6d9;
  string local_6d8;
  FeatureSet local_6b4;
  FeatureSet local_6b0;
  allocator<char> local_6a9;
  string local_6a8;
  FeatureSet local_684;
  FeatureSet local_680;
  allocator<char> local_679;
  string local_678;
  FeatureSet local_654;
  FeatureSet local_650;
  allocator<char> local_649;
  string local_648;
  FeatureSet local_624;
  FeatureSet local_620;
  allocator<char> local_619;
  string local_618;
  FeatureSet local_5f4;
  FeatureSet local_5f0;
  allocator<char> local_5e9;
  string local_5e8;
  FeatureSet local_5c4;
  FeatureSet local_5c0;
  allocator<char> local_5b9;
  string local_5b8;
  FeatureSet local_594;
  FeatureSet local_590;
  allocator<char> local_589;
  string local_588;
  FeatureSet local_564;
  FeatureSet local_560;
  allocator<char> local_559;
  string local_558;
  FeatureSet local_534;
  FeatureSet local_530;
  allocator<char> local_529;
  string local_528;
  FeatureSet local_504;
  FeatureSet local_500;
  allocator<char> local_4f9;
  string local_4f8;
  FeatureSet local_4d4;
  FeatureSet local_4d0;
  allocator<char> local_4c9;
  string local_4c8;
  FeatureSet local_4a4;
  FeatureSet local_4a0;
  allocator<char> local_499;
  string local_498;
  FeatureSet local_474;
  FeatureSet local_470;
  allocator<char> local_469;
  string local_468;
  FeatureSet local_444;
  FeatureSet local_440;
  allocator<char> local_439;
  string local_438;
  anon_class_8_1_8991fb9c local_418;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_410;
  allocator<char> local_3e9;
  string local_3e8 [39];
  allocator<char> local_3c1;
  string local_3c0 [39];
  allocator<char> local_399;
  string local_398 [39];
  allocator<char> local_371;
  string local_370 [32];
  anon_class_8_1_8991fb9c local_350;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_348;
  allocator<char> local_321;
  string local_320 [39];
  allocator<char> local_2f9;
  string local_2f8 [39];
  allocator<char> local_2d1;
  string local_2d0 [39];
  allocator<char> local_2a9;
  string local_2a8 [39];
  anon_class_1_0_00000001 local_281;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_280;
  allocator<char> local_259;
  string local_258 [39];
  allocator<char> local_231;
  string local_230 [39];
  allocator<char> local_209;
  string local_208 [39];
  allocator<char> local_1e1;
  string local_1e0 [32];
  anon_class_8_1_8991fb9c local_1c0;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1b8;
  allocator<char> local_191;
  string local_190 [39];
  allocator<char> local_169;
  string local_168 [39];
  allocator<char> local_141;
  string local_140 [39];
  allocator<char> local_119;
  string local_118 [32];
  anon_class_8_1_8991fb9c local_f8;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_f0;
  allocator<char> local_c9;
  string local_c8 [39];
  allocator<char> local_a1;
  string local_a0 [39];
  allocator<char> local_79;
  string local_78 [39];
  allocator<char> local_51;
  string local_50 [48];
  string *local_20;
  string *description_local;
  string *command_local;
  ToolOptions *this_local;
  
  local_20 = description;
  description_local = command;
  command_local = (string *)this;
  wasm::Options::Options(&this->super_Options,(string *)command,(string *)description);
  this->_vptr_ToolOptions = (_func_int **)&PTR_addPassArg_00159d68;
  PassOptions::PassOptions(&this->passOptions);
  this->quiet = false;
  this->preserveTypeOrder = false;
  this->profile = Normal;
  FeatureSet::FeatureSet(&this->enabledFeatures,0x22);
  FeatureSet::FeatureSet(&this->disabledFeatures,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"--mvp-features",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_78,"-mvp",&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a0,"Disable all non-MVP features",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"Tool options",&local_c9);
  local_f8.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::ToolOptions::ToolOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_1_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_f0,&local_f8);
  psVar1 = (string *)
           wasm::Options::add((string *)&this->super_Options,local_50,local_78,local_a0,
                              (Arguments)local_c8,(function *)0x0,SUB81(&local_f0,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_118,"--all-features",&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_140,"-all",&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_168,"Enable all features",&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_190,"Tool options",&local_191);
  local_1c0.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::ToolOptions::ToolOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_2_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_1b8,&local_1c0);
  psVar1 = (string *)
           wasm::Options::add(psVar1,local_118,local_140,local_168,(Arguments)local_190,
                              (function *)0x0,SUB81(&local_1b8,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"--detect-features",&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_208,"",&local_209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_230,"(deprecated - this flag does nothing)",&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_258,"Tool options",&local_259);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::ToolOptions::ToolOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_3_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_280,&local_281);
  psVar1 = (string *)
           wasm::Options::add(psVar1,local_1e0,local_208,local_230,(Arguments)local_258,
                              (function *)0x0,SUB81(&local_280,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2a8,"--quiet",&local_2a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2d0,"-q",&local_2d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2f8,"Emit less verbose output and hide trivial warnings.",&local_2f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_320,"Tool options",&local_321);
  local_350.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::ToolOptions::ToolOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_4_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_348,&local_350);
  psVar1 = (string *)
           wasm::Options::add(psVar1,local_2a8,local_2d0,local_2f8,(Arguments)local_320,
                              (function *)0x0,SUB81(&local_348,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_370,"--experimental-poppy",&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_398,"",&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3c0,"Parse wast files as Poppy IR for testing purposes.",&local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3e8,"Tool options",&local_3e9);
  local_418.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::ToolOptions::ToolOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_5_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_410,&local_418);
  wasm::Options::add(psVar1,local_370,local_398,local_3c0,(Arguments)local_3e8,(function *)0x0,
                     SUB81(&local_410,0));
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_410);
  std::__cxx11::string::~string(local_3e8);
  std::allocator<char>::~allocator(&local_3e9);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator(&local_399);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator(&local_371);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_348);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator(&local_321);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_280);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator(&local_259);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator(&local_231);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator(&local_209);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1b8);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator(&local_141);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_f0);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_438,"sign extension operations",&local_439);
  FeatureSet::FeatureSet(&local_440,0);
  FeatureSet::FeatureSet(&local_444,0);
  pTVar2 = addFeature(this,SignExt,&local_438,local_440,local_444);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_468,"atomic operations",&local_469);
  FeatureSet::FeatureSet(&local_470,0);
  FeatureSet::FeatureSet(&local_474,0);
  pTVar2 = addFeature(pTVar2,Atomics,&local_468,local_470,local_474);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_498,"mutable globals",&local_499);
  FeatureSet::FeatureSet(&local_4a0,0);
  FeatureSet::FeatureSet(&local_4a4,0);
  pTVar2 = addFeature(pTVar2,MutableGlobals,&local_498,local_4a0,local_4a4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"nontrapping float-to-int operations",&local_4c9);
  FeatureSet::FeatureSet(&local_4d0,0);
  FeatureSet::FeatureSet(&local_4d4,0);
  pTVar2 = addFeature(pTVar2,TruncSat,&local_4c8,local_4d0,local_4d4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f8,"SIMD operations and types",&local_4f9);
  FeatureSet::FeatureSet(&local_500,0);
  FeatureSet::FeatureSet(&local_504,0);
  pTVar2 = addFeature(pTVar2,SIMD,&local_4f8,local_500,local_504);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,"bulk memory operations",&local_529);
  FeatureSet::FeatureSet(&local_530,0x80000);
  FeatureSet::FeatureSet(&local_534,0);
  pTVar2 = addFeature(pTVar2,BulkMemory,&local_528,local_530,local_534);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_558,"memory.copy and memory.fill",&local_559);
  FeatureSet::FeatureSet(&local_560,0);
  FeatureSet::FeatureSet(&local_564,0x10);
  pTVar2 = addFeature(pTVar2,BulkMemoryOpt,&local_558,local_560,local_564);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_588,
             "LEB encoding of call-indirect (Ignored for compatibility as it has no effect on Binaryen)"
             ,&local_589);
  FeatureSet::FeatureSet(&local_590,0);
  FeatureSet::FeatureSet(&local_594,0);
  pTVar2 = addFeature(pTVar2,CallIndirectOverlong,&local_588,local_590,local_594);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b8,"exception handling operations",&local_5b9);
  FeatureSet::FeatureSet(&local_5c0,0);
  FeatureSet::FeatureSet(&local_5c4,0);
  pTVar2 = addFeature(pTVar2,ExceptionHandling,&local_5b8,local_5c0,local_5c4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5e8,"tail call operations",&local_5e9);
  FeatureSet::FeatureSet(&local_5f0,0);
  FeatureSet::FeatureSet(&local_5f4,0);
  pTVar2 = addFeature(pTVar2,TailCall,&local_5e8,local_5f0,local_5f4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_618,"reference types",&local_619);
  FeatureSet::FeatureSet(&local_620,0);
  FeatureSet::FeatureSet(&local_624,0);
  pTVar2 = addFeature(pTVar2,ReferenceTypes,&local_618,local_620,local_624);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_648,"multivalue functions",&local_649);
  FeatureSet::FeatureSet(&local_650,0);
  FeatureSet::FeatureSet(&local_654,0);
  pTVar2 = addFeature(pTVar2,Multivalue,&local_648,local_650,local_654);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_678,"garbage collection",&local_679);
  FeatureSet::FeatureSet(&local_680,0);
  FeatureSet::FeatureSet(&local_684,0);
  pTVar2 = addFeature(pTVar2,GC,&local_678,local_680,local_684);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a8,"memory64",&local_6a9);
  FeatureSet::FeatureSet(&local_6b0,0);
  FeatureSet::FeatureSet(&local_6b4,0);
  pTVar2 = addFeature(pTVar2,Memory64,&local_6a8,local_6b0,local_6b4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d8,"relaxed SIMD",&local_6d9)
  ;
  FeatureSet::FeatureSet(&local_6e0,0);
  FeatureSet::FeatureSet(&local_6e4,0);
  pTVar2 = addFeature(pTVar2,RelaxedSIMD,&local_6d8,local_6e0,local_6e4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_708,"extended const expressions",&local_709);
  FeatureSet::FeatureSet(&local_710,0);
  FeatureSet::FeatureSet(&local_714,0);
  pTVar2 = addFeature(pTVar2,ExtendedConst,&local_708,local_710,local_714);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_738,"strings",&local_739);
  FeatureSet::FeatureSet(&local_740,0);
  FeatureSet::FeatureSet(&local_744,0);
  pTVar2 = addFeature(pTVar2,Strings,&local_738,local_740,local_744);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_768,"multimemory",&local_769);
  FeatureSet::FeatureSet(&local_770,0);
  FeatureSet::FeatureSet(&local_774,0);
  pTVar2 = addFeature(pTVar2,MultiMemory,&local_768,local_770,local_774);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_798,"stack switching",&local_799);
  FeatureSet::FeatureSet(&local_7a0,0);
  FeatureSet::FeatureSet(&local_7a4,0);
  pTVar2 = addFeature(pTVar2,StackSwitching,&local_798,local_7a0,local_7a4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7c8,"shared-everything threads",&local_7c9);
  FeatureSet::FeatureSet(&local_7d0,0);
  FeatureSet::FeatureSet(&local_7d4,0);
  pTVar2 = addFeature(pTVar2,SharedEverything,&local_7c8,local_7d0,local_7d4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7f8,"float 16 operations",&local_7f9);
  FeatureSet::FeatureSet(&local_800,0);
  FeatureSet::FeatureSet(&local_804,0);
  pTVar2 = addFeature(pTVar2,FP16,&local_7f8,local_800,local_804);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_828,"custom descriptors (RTTs) and exact references",&local_829);
  FeatureSet::FeatureSet(&local_830,0);
  FeatureSet::FeatureSet(&local_834,0);
  pTVar2 = addFeature(pTVar2,CustomDescriptors,&local_828,local_830,local_834);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_858,"--enable-typed-function-references",&local_859);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_880,"",&local_881);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_8a8,"Deprecated compatibility flag",&local_8a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8d0,"Tool options",&local_8d1);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::ToolOptions::ToolOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_6_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_8f8,&local_8f9);
  psVar1 = (string *)
           wasm::Options::add((string *)&pTVar2->super_Options,local_858,local_880,local_8a8,
                              (Arguments)local_8d0,(function *)0x0,SUB81(&local_8f8,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_920,"--disable-typed-function-references",&local_921);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_948,"",&local_949);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_970,"Deprecated compatibility flag",&local_971);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_998,"Tool options",&local_999);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::ToolOptions::ToolOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_7_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_9c0,&local_9c1);
  psVar1 = (string *)
           wasm::Options::add(psVar1,local_920,local_948,local_970,(Arguments)local_998,
                              (function *)0x0,SUB81(&local_9c0,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_9e8,"--no-validation",&local_9e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a10,"-n",&local_a11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a38,"Disables validation, assumes inputs are correct",&local_a39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a60,"Tool options",&local_a61);
  local_a90.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::ToolOptions::ToolOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_8_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_a88,&local_a90);
  psVar1 = (string *)
           wasm::Options::add(psVar1,local_9e8,local_a10,local_a38,(Arguments)local_a60,
                              (function *)0x0,SUB81(&local_a88,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_ab0,"--pass-arg",&local_ab1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_ad8,"-pa",&local_ad9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b00,
             "An argument passed along to optimization passes being run. Must be in the form KEY@VALUE.  If KEY is the name of a pass then it applies to the closest instance of that pass before us. If KEY is not the name of a pass then it is a global option that applies to all pass instances that read it."
             ,&local_b01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b28,"Tool options",&local_b29);
  local_b58.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::ToolOptions::ToolOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_9_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_b50,&local_b58);
  psVar1 = (string *)
           wasm::Options::add(psVar1,local_ab0,local_ad8,local_b00,(Arguments)local_b28,
                              (function *)0x2,SUB81(&local_b50,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b78,"--closed-world",&local_b79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_ba0,"-cw",&local_ba1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_bc8,
             "Assume code outside of the module does not inspect or interact with GC and function references, even if they are passed out. The outside may hold on to them and pass them back in, but not inspect their contents or call them."
             ,&local_bc9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_bf0,"Tool options",&local_bf1);
  local_c20.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::ToolOptions::ToolOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_10_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_c18,&local_c20);
  psVar1 = (string *)
           wasm::Options::add(psVar1,local_b78,local_ba0,local_bc8,(Arguments)local_bf0,
                              (function *)0x0,SUB81(&local_c18,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c40,"--preserve-type-order",&local_c41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c68,"",&local_c69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c90,
             "Preserve the order of types from the input (useful for debugging and testing)",
             &local_c91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_cb8,"Tool options",&local_cb9);
  local_ce8.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::ToolOptions::ToolOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_11_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_ce0,&local_ce8);
  psVar1 = (string *)
           wasm::Options::add(psVar1,local_c40,local_c68,local_c90,(Arguments)local_cb8,
                              (function *)0x0,SUB81(&local_ce0,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d08,"--generate-stack-ir",&local_d09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d30,"",&local_d31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d58,"generate StackIR during writing",&local_d59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d80,"Tool options",&local_d81);
  local_db0.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::ToolOptions::ToolOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_12_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_da8,&local_db0);
  psVar1 = (string *)
           wasm::Options::add(psVar1,local_d08,local_d30,local_d58,(Arguments)local_d80,
                              (function *)0x0,SUB81(&local_da8,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_dd0,"--optimize-stack-ir",&local_dd1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_df8,"",&local_df9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_e20,"optimize StackIR during writing",&local_e21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e48,"Tool options",&local_e49);
  local_e78.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::ToolOptions::ToolOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_13_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_e70,&local_e78);
  psVar1 = (string *)
           wasm::Options::add(psVar1,local_dd0,local_df8,local_e20,(Arguments)local_e48,
                              (function *)0x0,SUB81(&local_e70,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e98,"--print-stack-ir",&local_e99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_ec0,"",&local_ec1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_ee8,"print StackIR during writing",&local_ee9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f10,"Tool options",&local_f11);
  local_f40.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::ToolOptions::ToolOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_14_,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_f38,&local_f40);
  wasm::Options::add(psVar1,local_e98,local_ec0,local_ee8,(Arguments)local_f10,(function *)0x0,
                     SUB81(&local_f38,0));
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_f38);
  std::__cxx11::string::~string(local_f10);
  std::allocator<char>::~allocator(&local_f11);
  std::__cxx11::string::~string(local_ee8);
  std::allocator<char>::~allocator(&local_ee9);
  std::__cxx11::string::~string(local_ec0);
  std::allocator<char>::~allocator(&local_ec1);
  std::__cxx11::string::~string(local_e98);
  std::allocator<char>::~allocator(&local_e99);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_e70);
  std::__cxx11::string::~string(local_e48);
  std::allocator<char>::~allocator(&local_e49);
  std::__cxx11::string::~string(local_e20);
  std::allocator<char>::~allocator(&local_e21);
  std::__cxx11::string::~string(local_df8);
  std::allocator<char>::~allocator(&local_df9);
  std::__cxx11::string::~string(local_dd0);
  std::allocator<char>::~allocator(&local_dd1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_da8);
  std::__cxx11::string::~string(local_d80);
  std::allocator<char>::~allocator(&local_d81);
  std::__cxx11::string::~string(local_d58);
  std::allocator<char>::~allocator(&local_d59);
  std::__cxx11::string::~string(local_d30);
  std::allocator<char>::~allocator(&local_d31);
  std::__cxx11::string::~string(local_d08);
  std::allocator<char>::~allocator(&local_d09);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_ce0);
  std::__cxx11::string::~string(local_cb8);
  std::allocator<char>::~allocator(&local_cb9);
  std::__cxx11::string::~string(local_c90);
  std::allocator<char>::~allocator(&local_c91);
  std::__cxx11::string::~string(local_c68);
  std::allocator<char>::~allocator(&local_c69);
  std::__cxx11::string::~string(local_c40);
  std::allocator<char>::~allocator(&local_c41);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_c18);
  std::__cxx11::string::~string(local_bf0);
  std::allocator<char>::~allocator(&local_bf1);
  std::__cxx11::string::~string(local_bc8);
  std::allocator<char>::~allocator(&local_bc9);
  std::__cxx11::string::~string(local_ba0);
  std::allocator<char>::~allocator(&local_ba1);
  std::__cxx11::string::~string(local_b78);
  std::allocator<char>::~allocator(&local_b79);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_b50);
  std::__cxx11::string::~string(local_b28);
  std::allocator<char>::~allocator(&local_b29);
  std::__cxx11::string::~string(local_b00);
  std::allocator<char>::~allocator(&local_b01);
  std::__cxx11::string::~string(local_ad8);
  std::allocator<char>::~allocator(&local_ad9);
  std::__cxx11::string::~string(local_ab0);
  std::allocator<char>::~allocator(&local_ab1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_a88);
  std::__cxx11::string::~string(local_a60);
  std::allocator<char>::~allocator(&local_a61);
  std::__cxx11::string::~string(local_a38);
  std::allocator<char>::~allocator(&local_a39);
  std::__cxx11::string::~string(local_a10);
  std::allocator<char>::~allocator(&local_a11);
  std::__cxx11::string::~string(local_9e8);
  std::allocator<char>::~allocator(&local_9e9);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_9c0);
  std::__cxx11::string::~string(local_998);
  std::allocator<char>::~allocator(&local_999);
  std::__cxx11::string::~string(local_970);
  std::allocator<char>::~allocator(&local_971);
  std::__cxx11::string::~string(local_948);
  std::allocator<char>::~allocator(&local_949);
  std::__cxx11::string::~string(local_920);
  std::allocator<char>::~allocator(&local_921);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_8f8);
  std::__cxx11::string::~string(local_8d0);
  std::allocator<char>::~allocator(&local_8d1);
  std::__cxx11::string::~string(local_8a8);
  std::allocator<char>::~allocator(&local_8a9);
  std::__cxx11::string::~string(local_880);
  std::allocator<char>::~allocator(&local_881);
  std::__cxx11::string::~string(local_858);
  std::allocator<char>::~allocator(&local_859);
  std::__cxx11::string::~string((string *)&local_828);
  std::allocator<char>::~allocator(&local_829);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::allocator<char>::~allocator(&local_7f9);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::allocator<char>::~allocator(&local_7c9);
  std::__cxx11::string::~string((string *)&local_798);
  std::allocator<char>::~allocator(&local_799);
  std::__cxx11::string::~string((string *)&local_768);
  std::allocator<char>::~allocator(&local_769);
  std::__cxx11::string::~string((string *)&local_738);
  std::allocator<char>::~allocator(&local_739);
  std::__cxx11::string::~string((string *)&local_708);
  std::allocator<char>::~allocator(&local_709);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::allocator<char>::~allocator(&local_6d9);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::allocator<char>::~allocator(&local_6a9);
  std::__cxx11::string::~string((string *)&local_678);
  std::allocator<char>::~allocator(&local_679);
  std::__cxx11::string::~string((string *)&local_648);
  std::allocator<char>::~allocator(&local_649);
  std::__cxx11::string::~string((string *)&local_618);
  std::allocator<char>::~allocator(&local_619);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::allocator<char>::~allocator(&local_5e9);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  std::__cxx11::string::~string((string *)&local_588);
  std::allocator<char>::~allocator(&local_589);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator(&local_559);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator(&local_529);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::allocator<char>::~allocator(&local_4f9);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator(&local_4c9);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator(&local_499);
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator(&local_469);
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator(&local_439);
  return;
}

Assistant:

ToolOptions(const std::string& command, const std::string& description)
    : Options(command, description) {
    (*this)
      .add("--mvp-features",
           "-mvp",
           "Disable all non-MVP features",
           ToolOptionsCategory,
           Arguments::Zero,
           [this](Options*, const std::string&) {
             enabledFeatures.setMVP();
             disabledFeatures.setAll();
           })
      .add("--all-features",
           "-all",
           "Enable all features",
           ToolOptionsCategory,
           Arguments::Zero,
           [this](Options*, const std::string&) {
             enabledFeatures.setAll();
             disabledFeatures.setMVP();
           })
      .add("--detect-features",
           "",
           "(deprecated - this flag does nothing)",
           ToolOptionsCategory,
           Arguments::Zero,
           [](Options*, const std::string&) {})
      .add("--quiet",
           "-q",
           "Emit less verbose output and hide trivial warnings.",
           ToolOptionsCategory,
           Arguments::Zero,
           [this](Options*, const std::string&) { quiet = true; })
      .add(
        "--experimental-poppy",
        "",
        "Parse wast files as Poppy IR for testing purposes.",
        ToolOptionsCategory,
        Arguments::Zero,
        [this](Options*, const std::string&) { profile = IRProfile::Poppy; });
    (*this)
      .addFeature(FeatureSet::SignExt, "sign extension operations")
      .addFeature(FeatureSet::Atomics, "atomic operations")
      .addFeature(FeatureSet::MutableGlobals, "mutable globals")
      .addFeature(FeatureSet::TruncSat, "nontrapping float-to-int operations")
      .addFeature(FeatureSet::SIMD, "SIMD operations and types")
      .addFeature(FeatureSet::BulkMemory,
                  "bulk memory operations",
                  FeatureSet(FeatureSet::BulkMemoryOpt))
      .addFeature(FeatureSet::BulkMemoryOpt,
                  "memory.copy and memory.fill",
                  FeatureSet::None,
                  FeatureSet(FeatureSet::BulkMemory))
      .addFeature(FeatureSet::CallIndirectOverlong,
                  "LEB encoding of call-indirect (Ignored for compatibility as "
                  "it has no effect on Binaryen)")
      .addFeature(FeatureSet::ExceptionHandling,
                  "exception handling operations")
      .addFeature(FeatureSet::TailCall, "tail call operations")
      .addFeature(FeatureSet::ReferenceTypes, "reference types")
      .addFeature(FeatureSet::Multivalue, "multivalue functions")
      .addFeature(FeatureSet::GC, "garbage collection")
      .addFeature(FeatureSet::Memory64, "memory64")
      .addFeature(FeatureSet::RelaxedSIMD, "relaxed SIMD")
      .addFeature(FeatureSet::ExtendedConst, "extended const expressions")
      .addFeature(FeatureSet::Strings, "strings")
      .addFeature(FeatureSet::MultiMemory, "multimemory")
      .addFeature(FeatureSet::StackSwitching, "stack switching")
      .addFeature(FeatureSet::SharedEverything, "shared-everything threads")
      .addFeature(FeatureSet::FP16, "float 16 operations")
      .addFeature(FeatureSet::CustomDescriptors,
                  "custom descriptors (RTTs) and exact references")
      .add("--enable-typed-function-references",
           "",
           "Deprecated compatibility flag",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [](Options* o, const std::string& argument) {
             std::cerr
               << "Warning: Typed function references have been made part of "
                  "GC and --enable-typed-function-references is deprecated\n";
           })
      .add("--disable-typed-function-references",
           "",
           "Deprecated compatibility flag",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [](Options* o, const std::string& argument) {
             std::cerr
               << "Warning: Typed function references have been made part of "
                  "GC and --disable-typed-function-references is deprecated\n";
           })
      .add("--no-validation",
           "-n",
           "Disables validation, assumes inputs are correct",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [this](Options* o, const std::string& argument) {
             passOptions.validate = false;
           })
      .add("--pass-arg",
           "-pa",
           "An argument passed along to optimization passes being run. Must be "
           "in the form KEY@VALUE.  If KEY is the name of a pass then it "
           "applies to the closest instance of that pass before us. If KEY is "
           "not the name of a pass then it is a global option that applies to "
           "all pass instances that read it.",
           ToolOptionsCategory,
           Options::Arguments::N,
           [this](Options*, const std::string& argument) {
             std::string key, value;
             auto colon = argument.find('@');
             if (colon == std::string::npos) {
               key = argument;
               value = "1";
             } else {
               key = argument.substr(0, colon);
               value = argument.substr(colon + 1);
             }

             addPassArg(key, value);
           })
      .add(
        "--closed-world",
        "-cw",
        "Assume code outside of the module does not inspect or interact with "
        "GC and function references, even if they are passed out. The outside "
        "may hold on to them and pass them back in, but not inspect their "
        "contents or call them.",
        ToolOptionsCategory,
        Options::Arguments::Zero,
        [this](Options*, const std::string&) {
          passOptions.closedWorld = true;
        })
      .add(
        "--preserve-type-order",
        "",
        "Preserve the order of types from the input (useful for debugging and "
        "testing)",
        ToolOptionsCategory,
        Options::Arguments::Zero,
        [&](Options* o, const std::string& arguments) {
          preserveTypeOrder = true;
        })
      .add("--generate-stack-ir",
           "",
           "generate StackIR during writing",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [&](Options* o, const std::string& arguments) {
             passOptions.generateStackIR = true;
           })
      .add("--optimize-stack-ir",
           "",
           "optimize StackIR during writing",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [&](Options* o, const std::string& arguments) {
             // Also generate StackIR, to have something to optimize.
             passOptions.generateStackIR = true;
             passOptions.optimizeStackIR = true;
           })
      .add("--print-stack-ir",
           "",
           "print StackIR during writing",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [&](Options* o, const std::string& arguments) {
             // Also generate StackIR, to have something to print.
             passOptions.generateStackIR = true;
             passOptions.printStackIR = &std::cout;
           });
  }